

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_brusselator1D_manyvec.c
# Opt level: O2

int main(void)

{
  int iVar1;
  undefined8 *flagvalue;
  N_Vector flagvalue_00;
  N_Vector flagvalue_01;
  N_Vector flagvalue_02;
  void *pvVar2;
  void *pvVar3;
  FILE *__stream;
  long lVar4;
  int iVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  double dVar8;
  int flag;
  FILE *local_128;
  double local_120;
  FILE *local_118;
  FILE *local_110;
  SUNContext ctx;
  void *local_100;
  ulong local_f8;
  void *local_f0;
  N_Vector local_e8;
  void *local_e0;
  void *local_d8;
  void *local_d0;
  double local_c8;
  double local_c0;
  sunrealtype t;
  void *arkode_mem;
  long netf;
  long ncfn;
  long nni;
  long nfeLS;
  long nJv;
  long nlcf;
  long nli;
  long nsetups;
  long nfi;
  long nfe;
  long nst_a;
  long nst;
  N_Vector uvw [3];
  
  arkode_mem = (void *)0x0;
  flag = SUNContext_Create(0,&ctx);
  iVar5 = 1;
  iVar1 = check_flag(&flag,"SUNContext_Create",1);
  if (iVar1 == 0) {
    flagvalue = (undefined8 *)malloc(0x40);
    iVar1 = check_flag(flagvalue,"malloc",2);
    if (iVar1 == 0) {
      *flagvalue = 0xc9;
      flagvalue[2] = 0x3fe3333333333333;
      flagvalue[3] = 0x4000000000000000;
      flagvalue[4] = 0x3f50624dd2f1a9fc;
      flagvalue[5] = 0x3f50624dd2f1a9fc;
      flagvalue[6] = 0x3f50624dd2f1a9fc;
      flagvalue[7] = 0x3ee4f8b588e368f1;
      puts("\n1D Brusselator PDE test problem:");
      printf("    N = %li\n",*flagvalue);
      printf("    problem parameters:  a = %g,  b = %g,  ep = %g\n",(int)flagvalue[2],flagvalue[3],
             flagvalue[7]);
      printf("    diffusion coefficients:  du = %g,  dv = %g,  dw = %g\n",(int)flagvalue[4],
             flagvalue[5],flagvalue[6]);
      printf("    reltol = %.1e,  abstol = %.1e\n\n",0xa0b5ed8d,0x3ddb7cdfd9d7bdbb);
      flagvalue[1] = 0x3f747ae147ae147b;
      flagvalue_00 = (N_Vector)N_VNew_Serial(0xc9,ctx);
      iVar1 = check_flag(flagvalue_00,"N_VNew_Serial",0);
      if (iVar1 == 0) {
        flagvalue_01 = (N_Vector)N_VClone(flagvalue_00);
        iVar1 = check_flag(flagvalue_01,"N_VClone",0);
        if (iVar1 == 0) {
          flagvalue_02 = (N_Vector)N_VClone(flagvalue_00);
          iVar1 = check_flag(flagvalue_02,"N_VClone",0);
          if (iVar1 == 0) {
            uvw[0] = flagvalue_00;
            uvw[1] = flagvalue_01;
            uvw[2] = flagvalue_02;
            pvVar2 = (void *)N_VNew_ManyVector(3,uvw,ctx);
            iVar1 = check_flag(pvVar2,"N_VNew_ManyVector",0);
            if (iVar1 == 0) {
              local_e8 = flagvalue_02;
              pvVar3 = (void *)N_VGetArrayPointer(flagvalue_00);
              iVar1 = check_flag(pvVar3,"N_VGetArrayPointer",0);
              if (iVar1 == 0) {
                local_d8 = pvVar3;
                pvVar3 = (void *)N_VGetArrayPointer(flagvalue_01);
                iVar1 = check_flag(pvVar3,"N_VGetArrayPointer",0);
                if (iVar1 == 0) {
                  local_e0 = pvVar3;
                  pvVar3 = (void *)N_VGetArrayPointer(local_e8);
                  iVar1 = check_flag(pvVar3,"N_VGetArrayPointer",0);
                  if (iVar1 == 0) {
                    local_100 = pvVar2;
                    for (lVar4 = 0; lVar4 != 0xc9; lVar4 = lVar4 + 1) {
                      local_128 = (FILE *)((double)lVar4 * 3.141592653589793);
                      dVar8 = sin((double)flagvalue[1] * (double)local_128);
                      *(double *)((long)local_d8 + lVar4 * 8) = dVar8 * 0.1 + 0.6;
                      dVar8 = sin((double)flagvalue[1] * (double)local_128);
                      *(double *)((long)local_e0 + lVar4 * 8) = dVar8 * 0.1 + 3.3333333333333335;
                      dVar8 = sin((double)local_128 * (double)flagvalue[1]);
                      *(double *)((long)pvVar3 + lVar4 * 8) = dVar8 * 0.1 + 2.0;
                    }
                    pvVar2 = (void *)ARKStepCreate(0,fe,fi,local_100,ctx);
                    arkode_mem = pvVar2;
                    iVar1 = check_flag(pvVar2,"ARKStepCreate",0);
                    if (iVar1 == 0) {
                      flag = ARKodeSetUserData(pvVar2,flagvalue);
                      iVar5 = 1;
                      iVar1 = check_flag(&flag,"ARKodeSetUserData",1);
                      if (iVar1 == 0) {
                        local_f0 = pvVar2;
                        flag = ARKodeSStolerances(0xa0b5ed8d,0x3ddb7cdfd9d7bdbb,pvVar2);
                        iVar5 = 1;
                        iVar1 = check_flag(&flag,"ARKodeSStolerances",1);
                        if (iVar1 == 0) {
                          local_d0 = (void *)SUNLinSol_SPGMR(local_100,0,10,ctx);
                          iVar1 = check_flag(local_d0,"SUNLinSol_SPGMR",0);
                          pvVar2 = local_f0;
                          if (iVar1 == 0) {
                            flag = ARKodeSetLinearSolver(local_f0,local_d0,0);
                            iVar5 = 1;
                            iVar1 = check_flag(&flag,"ARKodeSetLinearSolver",1);
                            if (iVar1 == 0) {
                              flag = ARKodeSetJacTimes(pvVar2,0,JacVI);
                              iVar5 = 1;
                              iVar1 = check_flag(&flag,"ARKodeSetJacTimes",1);
                              if (iVar1 == 0) {
                                __stream = fopen("bruss_mesh.txt","w");
                                for (lVar4 = 0; lVar4 != 0xc9; lVar4 = lVar4 + 1) {
                                  fprintf(__stream,"  %.16e\n",
                                          SUB84((double)lVar4 * (double)flagvalue[1],0));
                                }
                                fclose(__stream);
                                local_128 = fopen("bruss_u.txt","w");
                                local_110 = fopen("bruss_v.txt","w");
                                local_118 = fopen("bruss_w.txt","w");
                                for (lVar4 = 0; lVar4 != 0xc9; lVar4 = lVar4 + 1) {
                                  fprintf(local_128," %.16e",
                                          (int)*(undefined8 *)((long)local_d8 + lVar4 * 8));
                                }
                                for (lVar4 = 0; lVar4 != 0xc9; lVar4 = lVar4 + 1) {
                                  fprintf(local_110," %.16e",
                                          (int)*(undefined8 *)((long)local_e0 + lVar4 * 8));
                                }
                                for (lVar4 = 0; lVar4 != 0xc9; lVar4 = lVar4 + 1) {
                                  fprintf(local_118," %.16e",
                                          (int)*(undefined8 *)((long)pvVar3 + lVar4 * 8));
                                }
                                fputc(10,local_128);
                                fputc(10,local_110);
                                fputc(10,local_118);
                                t = 0.0;
                                puts("        t      ||u||_rms   ||v||_rms   ||w||_rms");
                                puts("   ----------------------------------------------");
                                local_120 = 0.1;
                                for (local_f8 = 0; (int)local_f8 != 100;
                                    local_f8 = (ulong)((int)local_f8 + 1)) {
                                  flag = ARKodeEvolve(SUB84(local_120,0),local_f0,local_100,&t,1);
                                  iVar1 = check_flag(&flag,"ARKodeEvolve",1);
                                  if (iVar1 != 0) break;
                                  dVar8 = (double)N_VDotProd(flagvalue_00,flagvalue_00);
                                  dVar8 = dVar8 / 201.0;
                                  if (dVar8 < 0.0) {
                                    local_c0 = sqrt(dVar8);
                                  }
                                  else {
                                    local_c0 = SQRT(dVar8);
                                  }
                                  dVar8 = (double)N_VDotProd(flagvalue_01,flagvalue_01);
                                  dVar8 = dVar8 / 201.0;
                                  if (dVar8 < 0.0) {
                                    local_c8 = sqrt(dVar8);
                                  }
                                  else {
                                    local_c8 = SQRT(dVar8);
                                  }
                                  dVar8 = (double)N_VDotProd(local_e8,local_e8);
                                  dVar8 = dVar8 / 201.0;
                                  if (dVar8 < 0.0) {
                                    dVar8 = sqrt(dVar8);
                                  }
                                  else {
                                    dVar8 = SQRT(dVar8);
                                  }
                                  printf("  %10.6f  %10.6f  %10.6f  %10.6f\n",SUB84(t,0),local_c0,
                                         local_c8,dVar8);
                                  if (flag < 0) {
                                    fwrite("Solver failure, stopping integration\n",0x25,1,_stderr);
                                    break;
                                  }
                                  local_120 = local_120 + 0.1;
                                  for (lVar4 = 0; lVar4 != 0xc9; lVar4 = lVar4 + 1) {
                                    fprintf(local_128," %.16e",
                                            (int)*(undefined8 *)((long)local_d8 + lVar4 * 8));
                                  }
                                  for (lVar4 = 0; lVar4 != 0xc9; lVar4 = lVar4 + 1) {
                                    fprintf(local_110," %.16e",
                                            (int)*(undefined8 *)((long)local_e0 + lVar4 * 8));
                                  }
                                  for (lVar4 = 0; lVar4 != 0xc9; lVar4 = lVar4 + 1) {
                                    fprintf(local_118," %.16e",
                                            (int)*(undefined8 *)((long)pvVar3 + lVar4 * 8));
                                  }
                                  uVar6 = 0;
                                  uVar7 = 0x40240000;
                                  if (local_120 <= 10.0) {
                                    uVar6 = SUB84(local_120,0);
                                    uVar7 = (undefined4)((ulong)local_120 >> 0x20);
                                  }
                                  local_120 = (double)CONCAT44(uVar7,uVar6);
                                  fputc(10,local_128);
                                  fputc(10,local_110);
                                  fputc(10,local_118);
                                }
                                puts("   ----------------------------------------------");
                                fclose(local_128);
                                fclose(local_110);
                                fclose(local_118);
                                pvVar2 = local_f0;
                                flag = ARKodeGetNumSteps(local_f0,&nst);
                                check_flag(&flag,"ARKodeGetNumSteps",1);
                                flag = ARKodeGetNumStepAttempts(pvVar2,&nst_a);
                                check_flag(&flag,"ARKodeGetNumStepAttempts",1);
                                flag = ARKStepGetNumRhsEvals(pvVar2,&nfe,&nfi);
                                check_flag(&flag,"ARKStepGetNumRhsEvals",1);
                                flag = ARKodeGetNumLinSolvSetups(pvVar2,&nsetups);
                                check_flag(&flag,"ARKodeGetNumLinSolvSetups",1);
                                flag = ARKodeGetNumErrTestFails(pvVar2,&netf);
                                check_flag(&flag,"ARKodeGetNumErrTestFails",1);
                                flag = ARKodeGetNumNonlinSolvIters(pvVar2,&nni);
                                check_flag(&flag,"ARKodeGetNumNonlinSolvIters",1);
                                flag = ARKodeGetNumNonlinSolvConvFails(pvVar2,&ncfn);
                                check_flag(&flag,"ARKodeGetNumNonlinSolvConvFails",1);
                                flag = ARKodeGetNumLinIters(pvVar2,&nli);
                                check_flag(&flag,"ARKodeGetNumLinIters",1);
                                flag = ARKodeGetNumLinConvFails(pvVar2,&nlcf);
                                check_flag(&flag,"ARKodeGetNumLinConvFails",1);
                                flag = ARKodeGetNumJtimesEvals(pvVar2,&nJv);
                                check_flag(&flag,"ARKodeGetNumJtimesEvals",1);
                                flag = ARKodeGetNumLinRhsEvals(pvVar2,&nfeLS);
                                check_flag(&flag,"ARKodeGetNumLinRhsEvals",1);
                                puts("\nFinal Solver Statistics:");
                                iVar5 = 0;
                                printf("   Internal solver steps = %li (attempted = %li)\n",nst,
                                       nst_a);
                                printf("   Total RHS evals:  Fe = %li,  Fi = %li\n",nfe,nfi);
                                printf("   Total linear solver setups = %li\n",nsetups);
                                printf("   Total linear iterations = %li\n",nli);
                                printf("   Total linear convergence failures = %li\n",nlcf);
                                printf("   Total J*v evaluations = %li\n",nJv);
                                printf("   Total RHS evals in linear solver = %li\n",nfeLS);
                                printf("   Total number of Newton iterations = %li\n",nni);
                                printf("   Total number of nonlinear solver convergence failures = %li\n"
                                       ,ncfn);
                                printf("   Total number of error test failures = %li\n\n",netf);
                                N_VDestroy(local_100);
                                N_VDestroy(flagvalue_00);
                                N_VDestroy(flagvalue_01);
                                N_VDestroy(local_e8);
                                free(flagvalue);
                                ARKodeFree(&arkode_mem);
                                SUNLinSolFree(local_d0);
                                SUNContext_Free(&ctx);
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar5;
}

Assistant:

int main(void)
{
  /* general problem parameters */
  sunrealtype T0    = ZERO;             /* initial time */
  sunrealtype Tf    = SUN_RCONST(10.0); /* final time */
  int Nt            = 100;              /* total number of output times */
  int Nvar          = 3;                /* number of solution fields */
  UserData userdata = NULL;
  sunrealtype *udata, *vdata, *wdata;
  sunindextype N     = 201;             /* spatial mesh size */
  sunrealtype a      = SUN_RCONST(0.6); /* problem parameters */
  sunrealtype b      = SUN_RCONST(2.0);
  sunrealtype du     = SUN_RCONST(0.001);
  sunrealtype dv     = SUN_RCONST(0.001);
  sunrealtype dw     = SUN_RCONST(0.001);
  sunrealtype ep     = SUN_RCONST(1.0e-5); /* stiffness parameter */
  sunrealtype reltol = SUN_RCONST(1.0e-6); /* tolerances */
  sunrealtype abstol = SUN_RCONST(1.0e-10);
  sunindextype i;

  /* general problem variables */
  int flag;          /* reusable error-checking flag */
  N_Vector y = NULL; /* empty manyvector for storing solution */
  N_Vector u = NULL; /* empty vectors for storing solution components */
  N_Vector v = NULL;
  N_Vector w = NULL;
  N_Vector uvw[3]; /* vector array composed of u,v,w component vectors */
  SUNLinearSolver LS = NULL; /* empty linear solver object */
  void* arkode_mem   = NULL; /* empty ARKode memory structure */
  sunrealtype pi, t, dTout, tout, unorm, vnorm, wnorm;
  FILE *FID, *UFID, *VFID, *WFID;
  int iout;
  long int nst, nst_a, nfe, nfi, nsetups, nli, nlcf, nJv, nfeLS, nni, ncfn, netf;

  /* Create the SUNDIALS context object for this simulation */
  SUNContext ctx;
  flag = SUNContext_Create(SUN_COMM_NULL, &ctx);
  if (check_flag(&flag, "SUNContext_Create", 1)) { return 1; }

  /* allocate udata structure */
  userdata = (UserData)malloc(sizeof(*userdata));
  if (check_flag((void*)userdata, "malloc", 2)) { return 1; }

  /* store the inputs in the UserData structure */
  userdata->N  = N;
  userdata->a  = a;
  userdata->b  = b;
  userdata->du = du;
  userdata->dv = dv;
  userdata->dw = dw;
  userdata->ep = ep;

  /* Initial problem output */
  printf("\n1D Brusselator PDE test problem:\n");
  printf("    N = %li\n", (long int)userdata->N);
  printf("    problem parameters:  a = %" GSYM ",  b = %" GSYM ",  ep = %" GSYM
         "\n",
         userdata->a, userdata->b, userdata->ep);
  printf("    diffusion coefficients:  du = %" GSYM ",  dv = %" GSYM
         ",  dw = %" GSYM "\n",
         userdata->du, userdata->dv, userdata->dw);
  printf("    reltol = %.1" ESYM ",  abstol = %.1" ESYM "\n\n", reltol, abstol);

  /* Initialize data structures */
  userdata->dx = ONE / (N - 1);         /* set spatial mesh spacing */
  u            = N_VNew_Serial(N, ctx); /* Create serial vectors */
  if (check_flag((void*)u, "N_VNew_Serial", 0)) { return 1; }
  v = N_VClone(u);
  if (check_flag((void*)v, "N_VClone", 0)) { return 1; }
  w = N_VClone(u);
  if (check_flag((void*)w, "N_VClone", 0)) { return 1; }

  /* Create manyvector for solution */
  uvw[0] = u;
  uvw[1] = v;
  uvw[2] = w;
  y      = N_VNew_ManyVector(Nvar, uvw, ctx);
  if (check_flag((void*)y, "N_VNew_ManyVector", 0)) { return 1; }

  udata = N_VGetArrayPointer(u); /* Access data array for new NVector u */
  if (check_flag((void*)udata, "N_VGetArrayPointer", 0)) { return 1; }
  vdata = N_VGetArrayPointer(v); /* Access data array for new NVector v */
  if (check_flag((void*)vdata, "N_VGetArrayPointer", 0)) { return 1; }
  wdata = N_VGetArrayPointer(w); /* Access data array for new NVector w */
  if (check_flag((void*)wdata, "N_VGetArrayPointer", 0)) { return 1; }

  /* Set initial conditions into y */
  pi = SUN_RCONST(4.0) * atan(ONE);
  for (i = 0; i < N; i++)
  {
    udata[i] = a + SUN_RCONST(0.1) * sin(pi * i * userdata->dx);     /* u */
    vdata[i] = b / a + SUN_RCONST(0.1) * sin(pi * i * userdata->dx); /* v */
    wdata[i] = b + SUN_RCONST(0.1) * sin(pi * i * userdata->dx);     /* w */
  }

  /* Call ARKStepCreate to initialize the ARK timestepper module and
     specify the right-hand side function in y'=f(t,y), the inital time
     T0, and the initial dependent variable vector y.  Note: since this
     problem is fully implicit, we set f_E to NULL and f_I to f. */
  arkode_mem = ARKStepCreate(fe, fi, T0, y, ctx);
  if (check_flag((void*)arkode_mem, "ARKStepCreate", 0)) { return 1; }

  /* Set routines */
  flag = ARKodeSetUserData(arkode_mem,
                           (void*)userdata); /* Pass udata to user functions */
  if (check_flag(&flag, "ARKodeSetUserData", 1)) { return 1; }
  flag = ARKodeSStolerances(arkode_mem, reltol, abstol); /* Specify tolerances */
  if (check_flag(&flag, "ARKodeSStolerances", 1)) { return 1; }

  /* Initialize spgmr solver */
  LS = SUNLinSol_SPGMR(y, SUN_PREC_NONE, 10, ctx);
  if (check_flag((void*)LS, "SUNLinSol_SPGMR", 0)) { return 1; }

  /* Linear solver interface */
  flag = ARKodeSetLinearSolver(arkode_mem, LS, NULL); /* Attach linear solver */
  if (check_flag(&flag, "ARKodeSetLinearSolver", 1)) { return 1; }
  flag = ARKodeSetJacTimes(arkode_mem, NULL,
                           JacVI); /* Set the Jacobian-vector product */
  if (check_flag(&flag, "ARKodeSetJacTimes", 1)) { return 1; }

  /* output spatial mesh to disk */
  FID = fopen("bruss_mesh.txt", "w");
  for (i = 0; i < N; i++)
  {
    fprintf(FID, "  %.16" ESYM "\n", userdata->dx * i);
  }
  fclose(FID);

  /* Open output streams for results, access data array */
  UFID = fopen("bruss_u.txt", "w");
  VFID = fopen("bruss_v.txt", "w");
  WFID = fopen("bruss_w.txt", "w");

  /* output initial condition to disk */
  for (i = 0; i < N; i++) { fprintf(UFID, " %.16" ESYM "", udata[i]); }
  for (i = 0; i < N; i++) { fprintf(VFID, " %.16" ESYM "", vdata[i]); }
  for (i = 0; i < N; i++) { fprintf(WFID, " %.16" ESYM "", wdata[i]); }
  fprintf(UFID, "\n");
  fprintf(VFID, "\n");
  fprintf(WFID, "\n");

  /* Main time-stepping loop: calls ARKodeEvolve to perform the integration, then
     prints results.  Stops when the final time has been reached */
  t     = T0;
  dTout = (Tf - T0) / Nt;
  tout  = T0 + dTout;
  printf("        t      ||u||_rms   ||v||_rms   ||w||_rms\n");
  printf("   ----------------------------------------------\n");
  for (iout = 0; iout < Nt; iout++)
  {
    /* call integrator */
    flag = ARKodeEvolve(arkode_mem, tout, y, &t, ARK_NORMAL);
    if (check_flag(&flag, "ARKodeEvolve", 1)) { break; }

    /* print solution statistics */
    unorm = N_VDotProd(u, u);
    unorm = sqrt(unorm / N);
    vnorm = N_VDotProd(v, v);
    vnorm = sqrt(vnorm / N);
    wnorm = N_VDotProd(w, w);
    wnorm = sqrt(wnorm / N);
    printf("  %10.6" FSYM "  %10.6" FSYM "  %10.6" FSYM "  %10.6" FSYM "\n", t,
           unorm, vnorm, wnorm);

    /* check integrator flag */
    if (flag >= 0)
    { /* successful solve: update output time */
      tout += dTout;
      tout = (tout > Tf) ? Tf : tout;
    }
    else
    { /* unsuccessful solve: break */
      fprintf(stderr, "Solver failure, stopping integration\n");
      break;
    }

    /* output results to disk */
    for (i = 0; i < N; i++) { fprintf(UFID, " %.16" ESYM "", udata[i]); }
    for (i = 0; i < N; i++) { fprintf(VFID, " %.16" ESYM "", vdata[i]); }
    for (i = 0; i < N; i++) { fprintf(WFID, " %.16" ESYM "", wdata[i]); }
    fprintf(UFID, "\n");
    fprintf(VFID, "\n");
    fprintf(WFID, "\n");
  }
  printf("   ----------------------------------------------\n");
  fclose(UFID);
  fclose(VFID);
  fclose(WFID);

  /* Print some final statistics */
  flag = ARKodeGetNumSteps(arkode_mem, &nst);
  check_flag(&flag, "ARKodeGetNumSteps", 1);
  flag = ARKodeGetNumStepAttempts(arkode_mem, &nst_a);
  check_flag(&flag, "ARKodeGetNumStepAttempts", 1);
  flag = ARKStepGetNumRhsEvals(arkode_mem, &nfe, &nfi);
  check_flag(&flag, "ARKStepGetNumRhsEvals", 1);
  flag = ARKodeGetNumLinSolvSetups(arkode_mem, &nsetups);
  check_flag(&flag, "ARKodeGetNumLinSolvSetups", 1);
  flag = ARKodeGetNumErrTestFails(arkode_mem, &netf);
  check_flag(&flag, "ARKodeGetNumErrTestFails", 1);
  flag = ARKodeGetNumNonlinSolvIters(arkode_mem, &nni);
  check_flag(&flag, "ARKodeGetNumNonlinSolvIters", 1);
  flag = ARKodeGetNumNonlinSolvConvFails(arkode_mem, &ncfn);
  check_flag(&flag, "ARKodeGetNumNonlinSolvConvFails", 1);
  flag = ARKodeGetNumLinIters(arkode_mem, &nli);
  check_flag(&flag, "ARKodeGetNumLinIters", 1);
  flag = ARKodeGetNumLinConvFails(arkode_mem, &nlcf);
  check_flag(&flag, "ARKodeGetNumLinConvFails", 1);
  flag = ARKodeGetNumJtimesEvals(arkode_mem, &nJv);
  check_flag(&flag, "ARKodeGetNumJtimesEvals", 1);
  flag = ARKodeGetNumLinRhsEvals(arkode_mem, &nfeLS);
  check_flag(&flag, "ARKodeGetNumLinRhsEvals", 1);

  printf("\nFinal Solver Statistics:\n");
  printf("   Internal solver steps = %li (attempted = %li)\n", nst, nst_a);
  printf("   Total RHS evals:  Fe = %li,  Fi = %li\n", nfe, nfi);
  printf("   Total linear solver setups = %li\n", nsetups);
  printf("   Total linear iterations = %li\n", nli);
  printf("   Total linear convergence failures = %li\n", nlcf);
  printf("   Total J*v evaluations = %li\n", nJv);
  printf("   Total RHS evals in linear solver = %li\n", nfeLS);
  printf("   Total number of Newton iterations = %li\n", nni);
  printf("   Total number of nonlinear solver convergence failures = %li\n",
         ncfn);
  printf("   Total number of error test failures = %li\n\n", netf);

  /* Clean up and return with successful completion */
  N_VDestroy(y); /* Free vectors */
  N_VDestroy(u);
  N_VDestroy(v);
  N_VDestroy(w);
  free(userdata);          /* Free user data */
  ARKodeFree(&arkode_mem); /* Free integrator memory */
  SUNLinSolFree(LS);       /* Free linear solver */
  SUNContext_Free(&ctx);   /* Free context */

  return 0;
}